

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall boost::filesystem::path::m_erase_redundant_separator(path *this,size_type sep_pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sep_pos_local;
  path *this_local;
  
  if (sep_pos != 0) {
    uVar1 = std::__cxx11::string::size();
    if (sep_pos < uVar1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      if (*pcVar2 == '/') {
        std::__cxx11::string::erase((ulong)this,sep_pos);
      }
    }
  }
  return;
}

Assistant:

void path::m_erase_redundant_separator(string_type::size_type sep_pos)
  {
    if (sep_pos                         // a separator was added
      && sep_pos < m_pathname.size()         // and something was appended
      && (m_pathname[sep_pos+1] == separator // and it was also separator
#      ifdef BOOST_WINDOWS_API
       || m_pathname[sep_pos+1] == preferred_separator  // or preferred_separator
#      endif
)) { m_pathname.erase(sep_pos, 1); } // erase the added separator
  }